

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O3

int lws_plat_ifconfig_ip(char *ifname,int fd,uint8_t *ip,uint8_t *mask_ip,uint8_t *gateway_ip)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *format;
  rtentry route;
  char local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  lws_strncpy(local_58,ifname,0x10);
  lws_plat_if_up(ifname,fd,0);
  uVar1 = *(uint *)ip;
  local_48 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18,2);
  uStack_40 = 0;
  iVar2 = ioctl(fd,0x8916,local_58);
  if (iVar2 < 0) {
    format = "%s: SIOCSIFADDR fail\n";
  }
  else {
    uVar1 = *(uint *)mask_ip;
    local_48 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18,2);
    uStack_40 = 0;
    iVar2 = ioctl(fd,0x891c);
    if (-1 < iVar2) {
      lws_plat_if_up(ifname,fd,1);
      iVar2 = ioctl(fd,0x890b);
      if (-1 < iVar2) {
        return 0;
      }
      uVar1 = *(uint *)gateway_ip;
      puVar3 = (uint *)__errno_location();
      _lws_log(1,"%s: SIOCADDRT 0x%x fail: %d\n","lws_plat_ifconfig_ip",
               (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18),(ulong)*puVar3);
      return 1;
    }
    format = "%s: SIOCSIFNETMASK fail\n";
  }
  _lws_log(1,format,"lws_plat_ifconfig_ip");
  return 1;
}

Assistant:

int
lws_plat_ifconfig_ip(const char *ifname, int fd, uint8_t *ip, uint8_t *mask_ip,
			uint8_t *gateway_ip)
{
#if defined(__linux__)
	struct sockaddr_in *addr;
	struct sockaddr_in sin;
	struct rtentry route;
	struct ifreq ifr;

	memset(&ifr, 0, sizeof(ifr));
	memset(&route, 0, sizeof(route));
	memset(&sin, 0, sizeof(sin));

	lws_strncpy(ifr.ifr_name, ifname, IFNAMSIZ);

	lws_plat_if_up(ifname, fd, 0);

	sin.sin_family = AF_INET;
	sin.sin_addr.s_addr = htonl(*(uint32_t *)ip);

	memcpy(&ifr.ifr_addr, &sin, sizeof(struct sockaddr));
	if (ioctl(fd, SIOCSIFADDR, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFADDR fail\n", __func__);
		return 1;
	}

	sin.sin_addr.s_addr = htonl(*(uint32_t *)mask_ip);
	memcpy(&ifr.ifr_addr, &sin, sizeof(struct sockaddr));
	if (ioctl(fd, SIOCSIFNETMASK, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFNETMASK fail\n", __func__);
		return 1;
	}

	lws_plat_if_up(ifname, fd, 1);

	addr = (struct sockaddr_in *)&route.rt_gateway;
	addr->sin_family = AF_INET;
	addr->sin_addr.s_addr = htonl(*(uint32_t *)gateway_ip);

	addr = (struct sockaddr_in *)&route.rt_dst;
	addr->sin_family = AF_INET;
	addr->sin_addr.s_addr = 0;

	addr = (struct sockaddr_in *)&route.rt_genmask;
	addr->sin_family = AF_INET;
	addr->sin_addr.s_addr = 0;

	route.rt_flags = RTF_UP | RTF_GATEWAY;
	route.rt_metric = 100;
	route.rt_dev = (char *)ifname;

	if (ioctl(fd, SIOCADDRT, &route) < 0) {
		lwsl_err("%s: SIOCADDRT 0x%x fail: %d\n", __func__,
			(unsigned int)htonl(*(uint32_t *)gateway_ip), LWS_ERRNO);
		return 1;
	}

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}